

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

void __thiscall QDialogButtonBox::~QDialogButtonBox(QDialogButtonBox *this)

{
  QDialogButtonBoxPrivate *this_00;
  QObject *pQVar1;
  
  *(undefined ***)this = &PTR_metaObject_007f8850;
  *(undefined ***)(this + 0x10) = &PTR__QDialogButtonBox_007f8a00;
  this_00 = *(QDialogButtonBoxPrivate **)(this + 8);
  this_00->ignoreShowAndHide = true;
  QDialogButtonBoxPrivate::disconnectAll(this_00);
  pQVar1 = (this_00->filter)._M_t.super___uniq_ptr_impl<QObject,_std::default_delete<QObject>_>._M_t
           .super__Tuple_impl<0UL,_QObject_*,_std::default_delete<QObject>_>.
           super__Head_base<0UL,_QObject_*,_false>._M_head_impl;
  (this_00->filter)._M_t.super___uniq_ptr_impl<QObject,_std::default_delete<QObject>_>._M_t.
  super__Tuple_impl<0UL,_QObject_*,_std::default_delete<QObject>_>.
  super__Head_base<0UL,_QObject_*,_false>._M_head_impl = (QObject *)0x0;
  if (pQVar1 != (QObject *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x20))();
  }
  QWidget::~QWidget((QWidget *)this);
  return;
}

Assistant:

QDialogButtonBox::~QDialogButtonBox()
{
    Q_D(QDialogButtonBox);

    d->ignoreShowAndHide = true;

    // QObjectPrivate::connect requires explicit disconnect in destructor
    // otherwise the connection may kick in on child destruction and reach
    // the parent's destroyed private object
    d->disconnectAll();
    // ditto event filter:
    d->filter.reset();
}